

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Figure.hpp
# Opt level: O2

void __thiscall sciplot::Figure::save(Figure *this,string *filename)

{
  size_t columns;
  pointer pvVar1;
  Plot *pPVar2;
  Figure *this_00;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  Plot *plot;
  Plot *this_01;
  EVP_PKEY_CTX *ctx;
  undefined1 in_R8B;
  gnuplot *this_02;
  size_t sVar7;
  vector<sciplot::Plot,_std::allocator<sciplot::Plot>_> *row;
  pointer pvVar8;
  undefined1 auVar9 [16];
  double dVar10;
  allocator<char> local_3c1;
  Figure *local_3c0;
  string *local_3b8;
  string cleanedfilename;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string size;
  string local_270;
  string local_250;
  ofstream script;
  
  std::__cxx11::string::string((string *)&local_250,(string *)filename);
  gnuplot::cleanpath(&cleanedfilename,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::rfind((char *)&cleanedfilename,0x1904d7);
  std::__cxx11::string::substr((ulong)&extension,(ulong)&cleanedfilename);
  std::ofstream::ofstream(&script,(string *)&this->m_scriptfilename,_S_out);
  if ((this->m_palette)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"dark2",&local_3c1);
  }
  else {
    std::__cxx11::string::string((string *)&local_390,(string *)&this->m_palette);
  }
  gnuplot::palettecmd((ostream *)&script,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  sVar7 = this->m_width;
  auVar9._8_4_ = (int)(sVar7 >> 0x20);
  auVar9._0_8_ = sVar7;
  auVar9._12_4_ = 0x45300000;
  dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0);
  uVar6 = (ulong)dVar10;
  this_02 = (gnuplot *)0x143;
  if (sVar7 != 0) {
    this_02 = (gnuplot *)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
  }
  sVar7 = 200;
  if (this->m_height != 0) {
    sVar7 = this->m_height;
  }
  bVar4 = std::operator==(&extension,"pdf");
  gnuplot::sizestr_abi_cxx11_(&size,this_02,sVar7,(ulong)bVar4,(bool)in_R8B);
  std::__cxx11::string::string((string *)&local_2b0,(string *)&extension);
  std::__cxx11::string::string((string *)&local_2d0,(string *)&size);
  (**(code **)(*(long *)(&(this->m_font).super_FontSpecsOf<sciplot::FontSpecs>.field_0x0 +
                        *(long *)(*(long *)&(this->m_font).super_FontSpecsOf<sciplot::FontSpecs> +
                                 -0x28)) + 0x10))(&local_2f0);
  gnuplot::saveterminalcmd((ostream *)&script,&local_2b0,&local_2d0,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_310,(string *)&cleanedfilename);
  gnuplot::outputcmd((ostream *)&script,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  sVar7 = this->m_layoutrows;
  columns = this->m_layoutcols;
  std::__cxx11::string::string((string *)&local_330,(string *)&this->m_title);
  local_3b8 = (string *)&this->m_scriptfilename;
  gnuplot::multiplotcmd((ostream *)&script,sVar7,columns,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  pvVar1 = (this->m_plots).
           super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_3c0 = this;
  for (pvVar8 = (this->m_plots).
                super__Vector_base<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>,_std::allocator<std::vector<sciplot::Plot,_std::allocator<sciplot::Plot>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1) {
    pPVar2 = (pvVar8->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (pvVar8->super__Vector_base<sciplot::Plot,_std::allocator<sciplot::Plot>_>).
                   _M_impl.super__Vector_impl_data._M_start; this_01 != pPVar2;
        this_01 = this_01 + 1) {
      Plot::repr_abi_cxx11_(&local_270,this_01);
      std::operator<<((ostream *)&script,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
    }
  }
  poVar5 = std::operator<<((ostream *)&script,"unset multiplot");
  psVar3 = local_3b8;
  this_00 = local_3c0;
  std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>((ostream *)&script);
  std::operator<<((ostream *)&script,"set output");
  std::endl<char,std::char_traits<char>>((ostream *)&script);
  std::ofstream::close();
  saveplotdata(this_00);
  std::__cxx11::string::string((string *)&local_350,psVar3);
  ctx = (EVP_PKEY_CTX *)0x0;
  gnuplot::runscript(&local_350,false);
  std::__cxx11::string::~string((string *)&local_350);
  if (this_00->m_autoclean == true) {
    cleanup(this_00,ctx);
  }
  std::__cxx11::string::~string((string *)&size);
  std::ofstream::~ofstream(&script);
  std::__cxx11::string::~string((string *)&extension);
  std::__cxx11::string::~string((string *)&cleanedfilename);
  return;
}

Assistant:

inline auto Figure::save(const std::string& filename) const -> void
{
    // Clean the file name to prevent errors
    auto cleanedfilename = gnuplot::cleanpath(filename);

    // Get extension from file name
    auto extension = cleanedfilename.substr(cleanedfilename.rfind(".") + 1);

    // Open script file
    std::ofstream script(m_scriptfilename);

    // Add palette info. Use default palette if the user hasn't set one
    gnuplot::palettecmd(script, m_palette.empty() ? internal::DEFAULT_PALETTE : m_palette);

    // Add terminal info
    auto width = m_width == 0 ? internal::DEFAULT_FIGURE_WIDTH : m_width;
    auto height = m_height == 0 ? internal::DEFAULT_FIGURE_HEIGHT : m_height;
    std::string size = gnuplot::sizestr(width, height, extension == "pdf");
    gnuplot::saveterminalcmd(script, extension, size, m_font);

    // Add output command
    gnuplot::outputcmd(script, cleanedfilename);

    // Add multiplot commands
    gnuplot::multiplotcmd(script, m_layoutrows, m_layoutcols, m_title);

    // Add the plot commands
    for(const auto& row : m_plots)
        for(const auto& plot : row)
            script << plot.repr();

    // Close multiplot
    script << "unset multiplot" << std::endl;

    // Unset the output
    script << std::endl;
    script << "set output";

    // Add an empty line at the end and close the script to avoid crashes with gnuplot
    script << std::endl;
    script.close();

    // save plot data to file(s)
    saveplotdata();

    // Save the figure as a file
    gnuplot::runscript(m_scriptfilename, false);

    // remove the temporary files if user wants to
    if(m_autoclean)
    {
        cleanup();
    }
}